

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractFlowAnalysis.h
# Opt level: O2

void __thiscall
slang::analysis::
AbstractFlowAnalysis<slang::analysis::DataFlowAnalysis,_slang::analysis::DataFlowState>::run
          (AbstractFlowAnalysis<slang::analysis::DataFlowAnalysis,_slang::analysis::DataFlowState>
           *this,Statement *stmt)

{
  DataFlowState *ctx;
  DataFlowState DStack_b8;
  
  ctx = &DStack_b8;
  DataFlowAnalysis::topState(&DStack_b8,(DataFlowAnalysis *)this);
  DataFlowState::operator=(&this->state,&DStack_b8);
  SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>::cleanup
            ((SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_> *)&DStack_b8,
             (EVP_PKEY_CTX *)ctx);
  ast::Statement::visit<slang::analysis::DataFlowAnalysis&>(stmt,(DataFlowAnalysis *)this);
  return;
}

Assistant:

void run(const Statement& stmt) {
        state = (DERIVED).topState();
        visit(stmt);
    }